

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunMemoryToRegister(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  ScopeData *pSVar1;
  VariableData *container;
  VmConstant *pVVar2;
  VmBlock *block_00;
  VmInstruction *this;
  VmValue *pVVar3;
  char *pcVar4;
  ArrayView<VmInstruction_*> phiNodes_00;
  VmType VVar5;
  Allocator *source;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  VmFunction *this_00;
  VariableData **ppVVar9;
  VmConstant **ppVVar10;
  VmValue **ppVVar11;
  VmInstruction *pVVar12;
  VmBlock **ppVVar13;
  SmallArray<VmValue_*,_4U> *this_01;
  VmInstruction **ppVVar14;
  VmInstruction *user_00;
  VmInstructionType in_R9D;
  VmType type;
  byte local_5c1;
  VmValue *edge;
  VmValue *option;
  uint argument;
  VmInstruction *user_1;
  VmInstruction *phi_1;
  VmInstruction *pVStack_550;
  uint k_1;
  VmInstruction *phi;
  undefined1 local_540 [4];
  uint k;
  SmallArray<VmInstruction_*,_32U> unusedPhiNodes;
  undefined8 uStack_420;
  undefined1 local_418 [8];
  SmallArray<VmValue_*,_32U> stack;
  VmValue *local_2f8;
  uint local_2ec;
  Allocator *pAStack_2e8;
  uint predecessorPos;
  VmType VStack_2e0;
  VmInstruction *placeholder;
  VmBlock *dominator;
  VmBlock *pVStack_2c0;
  uint dfPos;
  VmBlock *block;
  SmallArray<VmInstruction_*,_32U> phiNodes;
  uint worklistPos;
  bool found;
  VmInstruction *inst;
  uint containerUserPos;
  VmConstant *user;
  uint varUserPos;
  undefined1 local_170 [8];
  SmallArray<VmBlock_*,_32U> worklist;
  VmType vmType;
  VariableData *variable;
  VmBlock *pVStack_38;
  uint i;
  VmBlock *curr;
  ScopeData *scope;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  this_00 = getType<VmFunction>(value);
  if (((this_00 != (VmFunction *)0x0) && (this_00->firstBlock != (VmBlock *)0x0)) &&
     (this_00->function != (FunctionData *)0x0)) {
    VmFunction::UpdateDominatorTree(this_00,module,true);
    pSVar1 = this_00->scope;
    if ((pSVar1 != (ScopeData *)0x0) && (pSVar1 != ctx->globalScope)) {
      for (pVStack_38 = this_00->firstBlock; pVStack_38 != (VmBlock *)0x0;
          pVStack_38 = pVStack_38->nextSibling) {
        pVStack_38->hasAssignmentForId = 0;
        pVStack_38->hasPhiNodeForId = 0;
      }
      for (variable._4_4_ = 0; uVar7 = SmallArray<VariableData_*,_4U>::size(&pSVar1->allVariables),
          variable._4_4_ < uVar7; variable._4_4_ = variable._4_4_ + 1) {
        ppVVar9 = SmallArray<VariableData_*,_4U>::operator[](&pSVar1->allVariables,variable._4_4_);
        container = *ppVVar9;
        if (((container->isAlloca & 1U) == 0) ||
           (bVar6 = SmallArray<VmConstant_*,_8U>::empty(&container->users), !bVar6)) {
          bVar6 = IsMemberScope(container->scope);
          if (((bVar6 ^ 0xffU) & 1) == 0) {
            __assert_fail("!IsMemberScope(variable->scope)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x17c0,
                          "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)");
          }
          bVar6 = IsGlobalScope(container->scope);
          if (((bVar6 ^ 0xffU) & 1) == 0) {
            __assert_fail("!IsGlobalScope(variable->scope)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x17c1,
                          "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)");
          }
          bVar6 = HasAddressTaken(container);
          if ((!bVar6) &&
             ((((join_0x00000010_0x00000000_ = GetVmType(ctx,container->type),
                container->type == ctx->typeInt || (container->type == ctx->typeDouble)) ||
               (container->type == ctx->typeLong)) ||
              ((VmValueType)worklist.allocator == VM_TYPE_POINTER)))) {
            SmallArray<VmBlock_*,_32U>::SmallArray
                      ((SmallArray<VmBlock_*,_32U> *)local_170,module->allocator);
            bVar6 = IsArgumentVariable(this_00->function,container);
            if (bVar6) {
              this_00->firstBlock->hasAssignmentForId = variable._4_4_ + 1;
              SmallArray<VmBlock_*,_32U>::push_back
                        ((SmallArray<VmBlock_*,_32U> *)local_170,&this_00->firstBlock);
            }
            for (user._0_4_ = 0; uVar7 = SmallArray<VmConstant_*,_8U>::size(&container->users),
                (uint)user < uVar7; user._0_4_ = (uint)user + 1) {
              ppVVar10 = SmallArray<VmConstant_*,_8U>::operator[](&container->users,(uint)user);
              pVVar2 = *ppVVar10;
              for (inst._4_4_ = 0;
                  uVar7 = SmallArray<VmValue_*,_8U>::size(&(pVVar2->super_VmValue).users),
                  inst._4_4_ < uVar7; inst._4_4_ = inst._4_4_ + 1) {
                ppVVar11 = SmallArray<VmValue_*,_8U>::operator[]
                                     (&(pVVar2->super_VmValue).users,inst._4_4_);
                pVVar12 = getType<VmInstruction>(*ppVVar11);
                if (((pVVar12 != (VmInstruction *)0x0) && (7 < (int)pVVar12->cmd)) &&
                   (((int)pVVar12->cmd < 0xf &&
                    (ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar12->arguments,0),
                    (VmConstant *)*ppVVar11 == pVVar2)))) {
                  phiNodes.allocator._7_1_ = 0;
                  phiNodes.allocator._0_4_ = 0;
                  while( true ) {
                    uVar7 = (uint)phiNodes.allocator;
                    uVar8 = SmallArray<VmBlock_*,_32U>::size
                                      ((SmallArray<VmBlock_*,_32U> *)local_170);
                    local_5c1 = 0;
                    if (uVar7 < uVar8) {
                      local_5c1 = phiNodes.allocator._7_1_ ^ 0xff;
                    }
                    if ((local_5c1 & 1) == 0) break;
                    ppVVar13 = SmallArray<VmBlock_*,_32U>::operator[]
                                         ((SmallArray<VmBlock_*,_32U> *)local_170,
                                          (uint)phiNodes.allocator);
                    if (*ppVVar13 == pVVar12->parent) {
                      phiNodes.allocator._7_1_ = 1;
                    }
                    phiNodes.allocator._0_4_ = (uint)phiNodes.allocator + 1;
                  }
                  if ((phiNodes.allocator._7_1_ & 1) == 0) {
                    pVVar12->parent->hasAssignmentForId = variable._4_4_ + 1;
                    SmallArray<VmBlock_*,_32U>::push_back
                              ((SmallArray<VmBlock_*,_32U> *)local_170,&pVVar12->parent);
                  }
                }
              }
            }
            module->currentFunction = this_00;
            SmallArray<VmInstruction_*,_32U>::SmallArray
                      ((SmallArray<VmInstruction_*,_32U> *)&block,module->allocator);
            while (bVar6 = SmallArray<VmBlock_*,_32U>::empty
                                     ((SmallArray<VmBlock_*,_32U> *)local_170),
                  ((bVar6 ^ 0xffU) & 1) != 0) {
              ppVVar13 = SmallArray<VmBlock_*,_32U>::back((SmallArray<VmBlock_*,_32U> *)local_170);
              pVStack_2c0 = *ppVVar13;
              SmallArray<VmBlock_*,_32U>::pop_back((SmallArray<VmBlock_*,_32U> *)local_170);
              for (dominator._4_4_ = 0; uVar7 = dominator._4_4_,
                  uVar8 = SmallArray<VmBlock_*,_4U>::size(&pVStack_2c0->dominanceFrontier),
                  uVar7 < uVar8; dominator._4_4_ = dominator._4_4_ + 1) {
                ppVVar13 = SmallArray<VmBlock_*,_4U>::operator[]
                                     (&pVStack_2c0->dominanceFrontier,dominator._4_4_);
                VVar5 = stack0xffffffffffffffa8;
                placeholder = (VmInstruction *)*ppVVar13;
                if (((VmBlock *)placeholder)->hasPhiNodeForId < variable._4_4_ + 1) {
                  module->currentBlock = (VmBlock *)placeholder;
                  ((VmBlock *)placeholder)->insertPoint = (VmInstruction *)0x0;
                  pAStack_2e8 = worklist.allocator;
                  VStack_2e0.type = vmType.type;
                  VStack_2e0.size = vmType.size;
                  type.structType = (TypeBase *)0x4d;
                  type.type = vmType.type;
                  type.size = vmType.size;
                  source = worklist.allocator;
                  unique0x10000b75 = VVar5;
                  VStack_2e0.structType =
                       (TypeBase *)
                       anon_unknown.dwarf_c91b1::CreateInstruction
                                 ((anon_unknown_dwarf_c91b1 *)module,(VmModule *)0x0,
                                  (SynBase *)source,type,in_R9D);
                  for (local_2ec = 0; uVar7 = local_2ec,
                      uVar8 = SmallArray<VmBlock_*,_4U>::size
                                        ((SmallArray<VmBlock_*,_4U> *)&placeholder->nextSibling),
                      uVar7 < uVar8; local_2ec = local_2ec + 1) {
                    local_2f8 = (VmValue *)0x0;
                    SmallArray<VmValue_*,_4U>::push_back
                              ((SmallArray<VmValue_*,_4U> *)((long)VStack_2e0.structType + 0xa0),
                               &local_2f8);
                    this_01 = (SmallArray<VmValue_*,_4U> *)((long)VStack_2e0.structType + 0xa0);
                    ppVVar13 = SmallArray<VmBlock_*,_4U>::operator[]
                                         ((SmallArray<VmBlock_*,_4U> *)&placeholder->nextSibling,
                                          local_2ec);
                    stack.allocator = (Allocator *)*ppVVar13;
                    SmallArray<VmValue_*,_4U>::push_back(this_01,(VmValue **)&stack.allocator);
                    ppVVar13 = SmallArray<VmBlock_*,_4U>::operator[]
                                         ((SmallArray<VmBlock_*,_4U> *)&placeholder->nextSibling,
                                          local_2ec);
                    VmValue::AddUse(&(*ppVVar13)->super_VmValue,(VmValue *)VStack_2e0.structType);
                  }
                  pcVar4 = (container->name->name).end;
                  (((VmValue *)&(VStack_2e0.structType)->_vptr_TypeBase)->comment).begin =
                       (container->name->name).begin;
                  (((VmValue *)&(VStack_2e0.structType)->_vptr_TypeBase)->comment).end = pcVar4;
                  SmallArray<VmInstruction_*,_32U>::push_back
                            ((SmallArray<VmInstruction_*,_32U> *)&block,
                             (VmInstruction **)&VStack_2e0.structType);
                  placeholder->parent = (VmBlock *)(placeholder->arguments).allocator;
                  module->currentBlock = (VmBlock *)0x0;
                  *(uint *)((long)placeholder[1].arguments.little + 4) = variable._4_4_ + 1;
                  if (*(uint *)placeholder[1].arguments.little < variable._4_4_ + 1) {
                    *(uint *)placeholder[1].arguments.little = variable._4_4_ + 1;
                    SmallArray<VmBlock_*,_32U>::push_back
                              ((SmallArray<VmBlock_*,_32U> *)local_170,(VmBlock **)&placeholder);
                  }
                }
              }
            }
            SmallArray<VmValue_*,_32U>::SmallArray
                      ((SmallArray<VmValue_*,_32U> *)local_418,module->allocator);
            block_00 = this_00->firstBlock;
            ArrayView<VmInstruction*>::ArrayView<32u>
                      ((ArrayView<VmInstruction*> *)&unusedPhiNodes.allocator,
                       (SmallArray<VmInstruction_*,_32U> *)&block);
            phiNodes_00._8_8_ = uStack_420;
            phiNodes_00.data = (VmInstruction **)unusedPhiNodes.allocator;
            RenameMemoryToRegister
                      (ctx,module,block_00,(SmallArray<VmValue_*,_32U> *)local_418,container,
                       phiNodes_00);
            SmallArray<VmInstruction_*,_32U>::SmallArray
                      ((SmallArray<VmInstruction_*,_32U> *)local_540,module->allocator);
            for (phi._4_4_ = 0; uVar7 = phi._4_4_,
                uVar8 = SmallArray<VmInstruction_*,_32U>::size
                                  ((SmallArray<VmInstruction_*,_32U> *)&block), uVar7 < uVar8;
                phi._4_4_ = phi._4_4_ + 1) {
              ppVVar14 = SmallArray<VmInstruction_*,_32U>::operator[]
                                   ((SmallArray<VmInstruction_*,_32U> *)&block,phi._4_4_);
              pVStack_550 = *ppVVar14;
              uVar7 = this_00->nextSearchMarker;
              this_00->nextSearchMarker = uVar7 + 1;
              bVar6 = IsPhiUsed(pVStack_550,uVar7);
              if (!bVar6) {
                SmallArray<VmInstruction_*,_32U>::push_back
                          ((SmallArray<VmInstruction_*,_32U> *)local_540,&stack0xfffffffffffffab0);
              }
            }
            for (phi_1._4_4_ = 0;
                uVar7 = SmallArray<VmInstruction_*,_32U>::size
                                  ((SmallArray<VmInstruction_*,_32U> *)local_540),
                phi_1._4_4_ < uVar7; phi_1._4_4_ = phi_1._4_4_ + 1) {
              ppVVar14 = SmallArray<VmInstruction_*,_32U>::operator[]
                                   ((SmallArray<VmInstruction_*,_32U> *)local_540,phi_1._4_4_);
              pVVar12 = *ppVVar14;
              (pVVar12->super_VmValue).canBeRemoved = false;
              while (bVar6 = SmallArray<VmValue_*,_8U>::empty(&(pVVar12->super_VmValue).users),
                    ((bVar6 ^ 0xffU) & 1) != 0) {
                ppVVar11 = SmallArray<VmValue_*,_8U>::back(&(pVVar12->super_VmValue).users);
                user_00 = getType<VmInstruction>(*ppVVar11);
                if (user_00->cmd != VM_INST_PHI) {
                  __assert_fail("user->cmd == VM_INST_PHI",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                ,0x183e,
                                "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)"
                               );
                }
                for (option._4_4_ = 0; uVar7 = SmallArray<VmValue_*,_4U>::size(&user_00->arguments),
                    option._4_4_ < uVar7; option._4_4_ = option._4_4_ + 2) {
                  ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&user_00->arguments,option._4_4_)
                  ;
                  this = (VmInstruction *)*ppVVar11;
                  ppVVar11 = SmallArray<VmValue_*,_4U>::operator[]
                                       (&user_00->arguments,option._4_4_ + 1);
                  pVVar3 = *ppVVar11;
                  if (this == pVVar12) {
                    VmValue::RemoveUse((VmValue *)this,&user_00->super_VmValue);
                    VmValue::RemoveUse(pVVar3,&user_00->super_VmValue);
                    uVar7 = SmallArray<VmValue_*,_4U>::size(&user_00->arguments);
                    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&user_00->arguments,uVar7 - 2);
                    pVVar3 = *ppVVar11;
                    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[]
                                         (&user_00->arguments,option._4_4_);
                    *ppVVar11 = pVVar3;
                    uVar7 = SmallArray<VmValue_*,_4U>::size(&user_00->arguments);
                    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&user_00->arguments,uVar7 - 1);
                    pVVar3 = *ppVVar11;
                    ppVVar11 = SmallArray<VmValue_*,_4U>::operator[]
                                         (&user_00->arguments,option._4_4_ + 1);
                    *ppVVar11 = pVVar3;
                    SmallArray<VmValue_*,_4U>::pop_back(&user_00->arguments);
                    SmallArray<VmValue_*,_4U>::pop_back(&user_00->arguments);
                  }
                }
              }
              (pVVar12->super_VmValue).canBeRemoved = true;
            }
            module->currentFunction = (VmFunction *)0x0;
            SmallArray<VmInstruction_*,_32U>::~SmallArray
                      ((SmallArray<VmInstruction_*,_32U> *)local_540);
            SmallArray<VmValue_*,_32U>::~SmallArray((SmallArray<VmValue_*,_32U> *)local_418);
            SmallArray<VmInstruction_*,_32U>::~SmallArray
                      ((SmallArray<VmInstruction_*,_32U> *)&block);
            SmallArray<VmBlock_*,_32U>::~SmallArray((SmallArray<VmBlock_*,_32U> *)local_170);
          }
        }
      }
      VmFunction::UpdateLiveSets(this_00,module);
    }
  }
  return;
}

Assistant:

void RunMemoryToRegister(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		// Skip prototypes
		if(!function->firstBlock)
			return;

		// Skip global code
		if(!function->function)
			return;

		// Prepare dominator frontier data
		function->UpdateDominatorTree(module, true);

		ScopeData *scope = function->scope;

		if(!scope)
			return;

		// Keep stores to globals
		if(scope == ctx.globalScope)
			return;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		{
			curr->hasAssignmentForId = 0;
			curr->hasPhiNodeForId = 0;
		}

		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			assert(!IsMemberScope(variable->scope));
			assert(!IsGlobalScope(variable->scope));

			// Consider only the variables that don't have their address taken
			if(HasAddressTaken(variable))
				continue;

			// Consider only variables of simple types
			VmType vmType = GetVmType(ctx, variable->type);

			if(variable->type != ctx.typeInt && variable->type != ctx.typeDouble && variable->type != ctx.typeLong && vmType.type != VM_TYPE_POINTER)
				continue;

			// Initilize the worklist with a set of blocks that contain assignments to the variable
			SmallArray<VmBlock*, 32> worklist(module->allocator);

			// Argument is implicitly initialized in the entry block
			if(IsArgumentVariable(function->function, variable))
			{
				function->firstBlock->hasAssignmentForId = i + 1;
				worklist.push_back(function->firstBlock);
			}

			// Find all explicit assignments
			for(unsigned varUserPos = 0; varUserPos < variable->users.size(); varUserPos++)
			{
				VmConstant *user = variable->users[varUserPos];

				for(unsigned containerUserPos = 0; containerUserPos < user->users.size(); containerUserPos++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[containerUserPos]))
					{
						if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
						{
							bool found = false;

							for(unsigned worklistPos = 0; worklistPos < worklist.size() && !found; worklistPos++)
							{
								if(worklist[worklistPos] == inst->parent)
									found = true;
							}

							if(!found)
							{
								inst->parent->hasAssignmentForId = i + 1;
								worklist.push_back(inst->parent);
							}
						}
					}
				}
			}

			module->currentFunction = function;

			// Add placeholders for required phi nodes
			SmallArray<VmInstruction*, 32> phiNodes(module->allocator);

			while(!worklist.empty())
			{
				VmBlock *block = worklist.back();
				worklist.pop_back();

				for(unsigned dfPos = 0; dfPos < block->dominanceFrontier.size(); dfPos++)
				{
					VmBlock *dominator = block->dominanceFrontier[dfPos];

					if(dominator->hasPhiNodeForId < i + 1)
					{
						// Add phi for variable
						module->currentBlock = dominator;
						dominator->insertPoint = NULL;

						VmInstruction *placeholder = CreateInstruction(module, NULL, vmType, VM_INST_PHI);

						for(unsigned predecessorPos = 0; predecessorPos < dominator->predecessors.size(); predecessorPos++)
						{
							placeholder->arguments.push_back(NULL);
							placeholder->arguments.push_back(dominator->predecessors[predecessorPos]);

							dominator->predecessors[predecessorPos]->AddUse(placeholder);
						}

						placeholder->comment = variable->name->name;

						phiNodes.push_back(placeholder);

						dominator->insertPoint = dominator->lastInstruction;
						module->currentBlock = NULL;

						dominator->hasPhiNodeForId = i + 1;

						if(dominator->hasAssignmentForId < i + 1)
						{
							dominator->hasAssignmentForId = i + 1;
							worklist.push_back(dominator);
						}
					}
				}
			}

			SmallArray<VmValue*, 32> stack(module->allocator);

			RenameMemoryToRegister(ctx, module, function->firstBlock, stack, variable, phiNodes);

			// Remove dead phi instructions (prune ssa)
			SmallArray<VmInstruction*, 32> unusedPhiNodes(module->allocator);

			for(unsigned k = 0; k < phiNodes.size(); k++)
			{
				VmInstruction *phi = phiNodes[k];

				if(!IsPhiUsed(phi, function->nextSearchMarker++))
					unusedPhiNodes.push_back(phi);
			}

			for(unsigned k = 0; k < unusedPhiNodes.size(); k++)
			{
				VmInstruction *phi = unusedPhiNodes[k];

				phi->canBeRemoved = false;

				// Remove from all phi users (since this is an unused phi node, all remaining users are circular references from other phi nodes)
				while(!phi->users.empty())
				{
					VmInstruction *user = getType<VmInstruction>(phi->users.back());

					assert(user->cmd == VM_INST_PHI);

					for(unsigned argument = 0; argument < user->arguments.size(); argument += 2)
					{
						VmValue *option = user->arguments[argument];
						VmValue *edge = user->arguments[argument + 1];

						if(option == phi)
						{
							option->RemoveUse(user);
							edge->RemoveUse(user);

							user->arguments[argument] = user->arguments[user->arguments.size() - 2];
							user->arguments[argument + 1] = user->arguments[user->arguments.size() - 1];

							user->arguments.pop_back();
							user->arguments.pop_back();
						}
					}
				}

				phi->canBeRemoved = true;
			}

			module->currentFunction = NULL;
		}

		function->UpdateLiveSets(module);
	}
}